

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O1

void __thiscall
QtMWidgets::BlurEffect::BlurEffect(BlurEffect *this,QColor *c,Orientation o,QWidget *parent)

{
  undefined8 uVar1;
  
  QWidget::QWidget(&this->super_QWidget,parent,0);
  *(undefined ***)this = &PTR_metaObject_00196e30;
  *(undefined ***)&this->field_0x10 = &PTR__BlurEffect_00196fe0;
  this->policy = BlurAlwaysOff;
  this->orientation = o;
  uVar1 = *(undefined8 *)((long)&c->ct + 4);
  *(undefined8 *)&this->color = *(undefined8 *)c;
  *(undefined8 *)((long)&(this->color).ct + 4) = uVar1;
  this->pressure = 0;
  this->darkBlurWidth = 4;
  this->maxPressure = 20.0;
  return;
}

Assistant:

BlurEffect::BlurEffect( const QColor & c, Qt::Orientation o, QWidget * parent )
	:	QWidget( parent )
	,	policy( AbstractScrollArea::BlurAlwaysOff )
	,	orientation( o )
	,	color( c )
	,	pressure( 0 )
	,	darkBlurWidth( 4 )
	,	maxPressure( 20.0 )
{
}